

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bit * __thiscall lan::db::get_array_data(db *this,string *content)

{
  bool bVar1;
  db_bit_type dVar2;
  db_bit *pdVar3;
  db_bit *pdVar4;
  db *this_00;
  string buffer;
  
  this_00 = (db *)&buffer;
  pop_next(&buffer,this,content);
  dVar2 = convert_to_bit_type(this_00,*buffer._M_dataplus._M_p);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &buffer,"]");
  if (bVar1) {
    bVar1 = std::operator!=(&buffer,"(");
    if (!bVar1) goto LAB_001062b1;
    std::__cxx11::string::insert((ulong)content,(string *)0x0);
LAB_001062c6:
    if (dVar2 == Unsafe) {
      pdVar3 = (db_bit *)0x0;
      goto LAB_00106305;
    }
    if (dVar2 == Container) goto LAB_001062d0;
    pdVar3 = read_value_bit(this,content,true);
  }
  else {
LAB_001062b1:
    bVar1 = std::operator==(&buffer,"(");
    if (!bVar1) goto LAB_001062c6;
LAB_001062d0:
    pdVar3 = read_container_bit(this,content,true);
  }
  pdVar4 = get_array_data(this,content);
  pdVar3->nex = pdVar4;
LAB_00106305:
  std::__cxx11::string::~string((string *)&buffer);
  return pdVar3;
}

Assistant:

lan::db_bit * db::get_array_data(std::string & content){
            db_bit_type type = Unsafe;
            std::string buffer = pop_next(content);
            db_bit * bit = nullptr;
            type = convert_to_bit_type(buffer[0]);
            if(buffer != "]" and buffer != "(")
                content.insert(0, buffer);
            else if(buffer == "(")
                type = Container;
            if(type != Unsafe){
                switch(type){
                    case Container: bit = read_container_bit(content, true); break;
                    default: bit = read_value_bit(content, true); break;
                } bit->nex = (bit) ? get_array_data(content) : nullptr;
            } return bit;
        }